

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

void __thiscall KMaxDistance::printRec(KMaxDistance *this,char *heading,MaxRec *rec,int numDistMaxs)

{
  char *this_00;
  double dVar1;
  
  this_00 = "%s ";
  printf("%s ");
  if (rec->isUsed != 0) {
    printVals((KMaxDistance *)this_00,rec->vals,rec->numVals,numDistMaxs);
    dVar1 = sumVals((KMaxDistance *)this_00,rec->vals,rec->numVals);
    printf(" sum=%.3f (%.3f) isUsed=%d wasMin=%d imgIdx=%3d\n",dVar1,rec->sumVals,
           (ulong)(uint)rec->isUsed,(ulong)(uint)rec->wasMin,(ulong)(uint)rec->imgIdx);
    return;
  }
  return;
}

Assistant:

void KMaxDistance::printRec( const char *heading, MaxRec *rec, const int numDistMaxs ){
    printf( "%s ", heading );
    if ( rec->isUsed ){
        printVals( rec->vals, rec->numVals, numDistMaxs );
        double sum = sumVals( rec->vals, rec->numVals );
        printf( " sum=%.3f (%.3f) isUsed=%d wasMin=%d imgIdx=%3d\n", sum, rec->sumVals, rec->isUsed, rec->wasMin, rec->imgIdx );
    }
}